

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O2

void __thiscall
de::cmdline::detail::Parser::addOption<tcu::opt::Visibility>
          (Parser *this,Option<tcu::opt::Visibility> *option)

{
  OptInfo local_58;
  
  local_58.setDefault = (SetDefaultFunc)0x0;
  local_58.shortName = option->shortName;
  local_58.longName = option->longName;
  local_58.description = option->description;
  local_58.defaultValue = option->defaultValue;
  local_58.isFlag = false;
  local_58.parse = (GenericParseFunc)option->parse;
  local_58.namedValues = option->namedValues;
  local_58.namedValuesEnd = option->namedValuesEnd;
  local_58.namedValueStride = 0x10;
  local_58.dispatchParse = dispatchParse<tcu::opt::Visibility>;
  addOption(this,&local_58);
  return;
}

Assistant:

void Parser::addOption (const Option<OptType>& option)
{
	OptInfo opt;

	opt.shortName			= option.shortName;
	opt.longName			= option.longName;
	opt.description			= option.description;
	opt.defaultValue		= option.defaultValue;
	opt.isFlag				= isBooleanOpt<OptType>() && !option.namedValues;
	opt.parse				= (GenericParseFunc)option.parse;
	opt.namedValues			= (const void*)option.namedValues;
	opt.namedValuesEnd		= (const void*)option.namedValuesEnd;
	opt.namedValueStride	= sizeof(*option.namedValues);
	opt.dispatchParse		= dispatchParse<OptType>;

	if (opt.isFlag)
		opt.setDefault		= dispatchSetDefault<OptType>;

	addOption(opt);
}